

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall Frame::pushIntoOperandStack(Frame *this,Value operand)

{
  Frame *this_local;
  Value operand_local;
  
  operand_local._0_8_ = operand.data;
  this_local = operand._0_8_;
  std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::push
            (&this->_operandStack,(value_type *)&this_local);
  return;
}

Assistant:

void Frame::pushIntoOperandStack(Value operand) {
    _operandStack.push(operand);
}